

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indicator_quad.h
# Opt level: O2

Context __thiscall
mp::
IndicatorQuadConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_1>
::Convert(IndicatorQuadConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_1>
          *this,ItemType *indc,int param_2)

{
  int b;
  int bv;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  *this_01;
  Var VVar1;
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  allocator_type local_77e;
  allocator_type local_77d;
  Var local_77c;
  double local_778;
  LinTerms local_770;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> local_6f8;
  QuadraticExpr local_658;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_> local_498;
  QuadraticFunctionalConstraint local_3d0;
  QuadAndLinTerms local_1e8;
  
  b = indc->b_;
  this_00 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             *)(this->
               super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               ).mdl_cvt_;
  QuadAndLinTerms::QuadAndLinTerms(&local_1e8,&(indc->con_).super_QuadAndLinTerms);
  QuadAndLinTerms::QuadAndLinTerms(&local_658.super_QuadAndLinTerms,&local_1e8);
  local_658.constant_term_ = 0.0;
  QuadraticFunctionalConstraint::QuadraticFunctionalConstraint(&local_3d0,&local_658);
  VVar1 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::AssignResultVar2Args<mp::QuadraticFunctionalConstraint>(this_00,&local_3d0);
  QuadraticFunctionalConstraint::~QuadraticFunctionalConstraint(&local_3d0);
  QuadAndLinTerms::~QuadAndLinTerms(&local_658.super_QuadAndLinTerms);
  QuadAndLinTerms::~QuadAndLinTerms(&local_1e8);
  this_01 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
             *)(this->
               super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               ).mdl_cvt_;
  bv = indc->bv_;
  local_778 = 1.0;
  __l._M_len = 1;
  __l._M_array = &local_778;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_3d0,__l,&local_77d);
  __l_00._M_len = 1;
  __l_00._M_array = &local_77c;
  local_77c = VVar1;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_658,__l_00,&local_77e);
  LinTerms::LinTerms(&local_770,(vector<double,_std::allocator<double>_> *)&local_3d0,
                     (vector<int,_std::allocator<int>_> *)&local_658);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
            (&local_6f8,&local_770,(AlgConRhs<1>)(indc->con_).super_AlgConRhs<1>.rhs_,true);
  IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>::
  IndicatorConstraint(&local_498,b,bv,&local_6f8);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  ::AddConstraint<mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>>
            (this_01,&local_498);
  IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>::
  ~IndicatorConstraint(&local_498);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::~AlgebraicConstraint(&local_6f8);
  LinTerms::~LinTerms(&local_770);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_658);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&local_3d0);
  return (Context)CTX_ROOT;
}

Assistant:

Context Convert(const ItemType& indc, int ) {
    auto binvar=indc.get_binary_var();
    const auto& body = indc.get_constraint().GetBody();
    assert(body.is_quadratic());
    auto auxvar = GetMC().AssignResultVar2Args(  // auxvar = body + 0.0
          QuadraticFunctionalConstraint{ {body, 0.0} } );
    GetMC().AddConstraint( IndicatorLin{binvar, indc.get_binary_value(),
                                        LinCon{ { {1.0}, {auxvar} },
                                          indc.get_constraint().rhs() }} );
    return Context::CTX_ROOT;
  }